

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

int __thiscall HModel::util_chgColBoundsAll(HModel *this,double *XcolLower,double *XcolUpper)

{
  bool bVar1;
  reference pvVar2;
  long in_RDX;
  long in_RSI;
  HModel *in_RDI;
  double upper;
  double lower;
  int col;
  int in_stack_ffffffffffffff8c;
  HModel *in_stack_ffffffffffffff90;
  HModel *local_60;
  double local_48;
  int local_24;
  
  local_24 = 0;
  while( true ) {
    if (in_RDI->numCol <= local_24) {
      mlFg_Update(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      return 0;
    }
    local_48 = *(double *)(in_RSI + (long)local_24 * 8);
    local_60 = *(HModel **)(in_RDX + (long)local_24 * 8);
    bVar1 = hsol_isInfinity(in_RDI,local_48);
    if (bVar1) break;
    bVar1 = hsol_isInfinity(in_RDI,-(double)local_60);
    if (bVar1) {
      return -(local_24 + 1);
    }
    bVar1 = hsol_isInfinity(in_RDI,-local_48);
    if (!bVar1) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->colScale,(long)local_24);
      local_48 = local_48 / *pvVar2;
    }
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->colLower,(long)local_24);
    *pvVar2 = local_48;
    bVar1 = hsol_isInfinity(in_RDI,(double)local_60);
    if (!bVar1) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->colScale,(long)local_24);
      local_60 = (HModel *)((double)local_60 / *pvVar2);
    }
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->colUpper,(long)local_24);
    *pvVar2 = (value_type)local_60;
    local_24 = local_24 + 1;
    in_stack_ffffffffffffff90 = local_60;
  }
  return local_24 + 1;
}

Assistant:

int HModel::util_chgColBoundsAll(const double* XcolLower, const double* XcolUpper) {
  assert(XcolLower != NULL);
  assert(XcolUpper != NULL);
  for (int col = 0; col < numCol; ++col) {
    double lower = XcolLower[col];
    double upper = XcolUpper[col];
    //Check that the lower bound is not being set to +Inf
    if (hsol_isInfinity(lower)) return col+1;
    //Check that the lower bound is not being set to +Inf
    if (hsol_isInfinity(-upper)) return -(col+1);
    assert(lower<=upper);
    colLower[col] = (hsol_isInfinity(-lower) ? lower : lower / colScale[col]);
    colUpper[col] = (hsol_isInfinity( upper) ? upper : upper / colScale[col]);
    //    printf("[LB; Pr; UB] for column %2d are now [%11g, %11g, %11g] Dual = %g\n", col, colLower[col], workValue[col], colUpper[col], workDual[col]);
  }
  //Deduce the consequences of new bounds
  mlFg_Update(mlFg_action_NewBounds);
  return 0;
}